

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListOperation<float,false>::
     Window<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,duckdb::list_entry_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *list,idx_t lidx
               )

{
  ValidityMask *pVVar1;
  bool bVar2;
  CursorType *data;
  QuantileBindData *bind_data;
  idx_t n;
  type this;
  WindowQuantileState<float> *this_00;
  QuantileIncluded<float> included;
  QuantileIncluded<float> local_40;
  
  data = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<float,_duckdb::QuantileStandardType> *)l_state,partition);
  pVVar1 = partition->filter_mask;
  bind_data = (QuantileBindData *)
              optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  local_40.fmask = pVVar1;
  local_40.dmask = data;
  n = QuantileOperation::FrameSize<float>(&local_40,frames);
  if (n == 0) {
    FlatVector::VerifyFlatVector(list);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(list->validity).super_TemplatedValidityMask<unsigned_long>,lidx);
  }
  else {
    if ((g_state != (const_data_ptr_t)0x0) &&
       (bVar2 = QuantileState<float,_duckdb::QuantileStandardType>::HasTree
                          ((QuantileState<float,_duckdb::QuantileStandardType> *)g_state), bVar2)) {
      this = unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
             ::operator*((unique_ptr<duckdb::WindowQuantileState<float>,_std::default_delete<duckdb::WindowQuantileState<float>_>,_true>
                          *)(g_state + 0x18));
      WindowQuantileState<float>::WindowList<float,false>(this,data,frames,n,list,lidx,bind_data);
      return;
    }
    this_00 = QuantileState<float,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                        ((QuantileState<float,_duckdb::QuantileStandardType> *)l_state);
    WindowQuantileState<float>::UpdateSkip(this_00,data,frames,&local_40);
    WindowQuantileState<float>::WindowList<float,false>(this_00,data,frames,n,list,lidx,bind_data);
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
              (&(this_00->prevs).
                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
               &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &list,
	                   idx_t lidx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		// Result is a constant LIST<RESULT_TYPE> with a fixed length
		if (!n) {
			auto &lmask = FlatVector::Validity(list);
			lmask.Set(lidx, false);
			return;
		}

		if (gstate && gstate->HasTree()) {
			gstate->GetWindowState().template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
		} else {
			auto &window_state = state.GetOrCreateWindowState();
			window_state.UpdateSkip(data, frames, included);
			window_state.template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
			window_state.prevs = frames;
		}
	}